

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

void __thiscall
cmCMakePresetsGraph::PrintConfigurePresetList
          (cmCMakePresetsGraph *this,
          function<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&)> *filter,
          PrintPrecedingNewline *newline)

{
  pointer pbVar1;
  bool bVar2;
  mapped_type *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer __k;
  vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  presets;
  _Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  local_58;
  PrintPrecedingNewline *local_40;
  mapped_type *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar1 = (this->ConfigurePresetOrder).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = newline;
  for (__k = (this->ConfigurePresetOrder).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
    __args = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
             ::at(&this->ConfigurePresets,__k);
    if ((((__args->Unexpanded).super_Preset.Hidden == false) &&
        ((__args->Expanded).super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>
         ._M_payload.
         super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>.
         super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._M_engaged == true)) &&
       ((__args->Expanded).super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>.
        _M_payload.super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._M_payload.field2[0xa0]
        == '\x01')) {
      bVar2 = std::function<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&)>::operator()
                        (filter,&__args->Unexpanded);
      if (bVar2) {
        local_38 = __args;
        std::
        vector<cmCMakePresetsGraph::Preset_const*,std::allocator<cmCMakePresetsGraph::Preset_const*>>
        ::emplace_back<cmCMakePresetsGraph::Preset_const*>
                  ((vector<cmCMakePresetsGraph::Preset_const*,std::allocator<cmCMakePresetsGraph::Preset_const*>>
                    *)&local_58,(Preset **)&local_38);
      }
    }
  }
  if (local_58._M_impl.super__Vector_impl_data._M_start !=
      local_58._M_impl.super__Vector_impl_data._M_finish) {
    printPrecedingNewline(local_40);
    std::operator<<((ostream *)&std::cout,"Available configure presets:\n\n");
    PrintPresets((vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                  *)&local_58);
  }
  std::
  _Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ::~_Vector_base(&local_58);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintConfigurePresetList(
  const std::function<bool(const ConfigurePreset&)>& filter,
  PrintPrecedingNewline* newline) const
{
  std::vector<const cmCMakePresetsGraph::Preset*> presets;
  for (auto const& p : this->ConfigurePresetOrder) {
    auto const& preset = this->ConfigurePresets.at(p);
    if (!preset.Unexpanded.Hidden && preset.Expanded &&
        preset.Expanded->ConditionResult && filter(preset.Unexpanded)) {
      presets.push_back(
        static_cast<const cmCMakePresetsGraph::Preset*>(&preset.Unexpanded));
    }
  }

  if (!presets.empty()) {
    printPrecedingNewline(newline);
    std::cout << "Available configure presets:\n\n";
    cmCMakePresetsGraph::PrintPresets(presets);
  }
}